

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetLocalizedGMTPattern
          (TimeZoneFormat *this,UnicodeString *text,int32_t start,UBool param_3,int32_t *parsedLen)

{
  short sVar1;
  int iVar2;
  int8_t iVar3;
  int32_t iVar4;
  int _length;
  int _length_00;
  int32_t iVar5;
  int local_34;
  
  sVar1 = (this->fGMTPatternPrefix).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    _length_00 = (this->fGMTPatternPrefix).fUnion.fFields.fLength;
  }
  else {
    _length_00 = (int)sVar1 >> 5;
  }
  local_34 = _length_00;
  if (_length_00 < 1) {
LAB_002087fa:
    iVar4 = parseOffsetFields(this,text,start + _length_00,'\0',&local_34);
    iVar2 = local_34;
    if (local_34 != 0) {
      sVar1 = (this->fGMTPatternSuffix).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        _length = (this->fGMTPatternSuffix).fUnion.fFields.fLength;
      }
      else {
        _length = (int)sVar1 >> 5;
      }
      if ((_length < 1) ||
         (iVar3 = UnicodeString::caseCompare
                            (text,start + _length_00 + local_34,_length,&this->fGMTPatternSuffix,0),
         iVar3 == '\0')) {
        iVar5 = iVar2 + _length_00 + _length;
        goto LAB_0020887b;
      }
    }
  }
  else {
    iVar3 = UnicodeString::caseCompare(text,start,_length_00,&this->fGMTPatternPrefix,0);
    iVar4 = 0;
    if (iVar3 == '\0') goto LAB_002087fa;
  }
  iVar5 = 0;
LAB_0020887b:
  *parsedLen = iVar5;
  return iVar4;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetLocalizedGMTPattern(const UnicodeString& text, int32_t start, UBool /*isShort*/, int32_t& parsedLen) const {
    int32_t idx = start;
    int32_t offset = 0;
    UBool parsed = FALSE;

    do {
        // Prefix part
        int32_t len = fGMTPatternPrefix.length();
        if (len > 0 && text.caseCompare(idx, len, fGMTPatternPrefix, 0) != 0) {
            // prefix match failed
            break;
        }
        idx += len;

        // Offset part
        offset = parseOffsetFields(text, idx, FALSE, len);
        if (len == 0) {
            // offset field match failed
            break;
        }
        idx += len;

        len = fGMTPatternSuffix.length();
        if (len > 0 && text.caseCompare(idx, len, fGMTPatternSuffix, 0) != 0) {
            // no suffix match
            break;
        }
        idx += len;
        parsed = TRUE;
    } while (FALSE);

    parsedLen = parsed ? idx - start : 0;
    return offset;
}